

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.h
# Opt level: O1

string * spdlog::details::os::thread_name_abi_cxx11_(void)

{
  long lVar1;
  size_t sVar2;
  string *in_RDI;
  long *in_FS_OFFSET;
  char buffer [20];
  char acStack_68 [32];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if ((char)in_FS_OFFSET[-3] == '\0') {
    thread_name_abi_cxx11_();
  }
  if (in_FS_OFFSET[-6] == 0) {
    lVar1 = *in_FS_OFFSET;
    _thread_name(acStack_68,0x14);
    local_48[0] = local_38;
    sVar2 = strlen(acStack_68);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,acStack_68,acStack_68 + sVar2);
    std::__cxx11::string::operator=((string *)(lVar1 + -0x38),(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char*>();
  return in_RDI;
}

Assistant:

inline std::string thread_name()
{
    static const size_t    RECOMMENDED_BUFFER_SIZE = 20;
    char buffer[RECOMMENDED_BUFFER_SIZE];
    
#if defined(SPDLOG_DISABLE_TID_CACHING) || (defined(_MSC_VER) && (_MSC_VER < 1900)) || defined(__cplusplus_winrt) ||                       \
    (defined(__clang__) && !__has_feature(cxx_thread_local))
    _thread_name(buffer, sizeof(buffer));
    return std::string(buffer);
#else // cache thread name in thread local storage
    static thread_local std::string theThreadName; 
    if (theThreadName.empty())
    {
	_thread_name(buffer, sizeof(buffer));
	theThreadName = std::string(buffer);
    }
    return theThreadName;
#endif
}